

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O0

void __thiscall TextureImage::Texture::~Texture(Texture *this)

{
  Texture *this_local;
  
  ~Texture(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

virtual ~Texture() { clear(); }